

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsg_search.c
# Opt level: O0

char * fsg_search_hyp(ps_search_t *search,int32 *out_score)

{
  int iVar1;
  dict_t *d;
  dictword_t *pdVar2;
  dictword_t *pdVar3;
  int iVar4;
  s3wid_t sVar5;
  ps_lattice_t *dag_00;
  ps_latlink_t *link_00;
  fsg_hist_entry_t *pfVar6;
  size_t sVar7;
  char *pcVar8;
  char *local_e8;
  char *local_c0;
  int32 wid_1;
  char *baseword_1;
  fsg_link_t *fl_1;
  fsg_hist_entry_t *hist_entry_1;
  int32 wid;
  char *baseword;
  fsg_link_t *fl;
  fsg_hist_entry_t *hist_entry;
  ps_latlink_t *link;
  ps_lattice_t *dag;
  int bpidx;
  int bp;
  size_t len;
  char *c;
  dict_t *dict;
  fsg_search_t *fsgs;
  int32 *out_score_local;
  ps_search_t *search_local;
  
  d = search->dict;
  iVar4 = fsg_search_find_exit
                    ((fsg_search_t *)search,search[1].post,(uint)(byte)search[1].n_words,out_score);
  if (iVar4 < 1) {
    search_local = (ps_search_t *)0x0;
  }
  else if ((*(char *)((long)&search[1].n_words + 1) == '\0') || ((char)search[1].n_words == '\0')) {
    _bpidx = 0;
    dag._4_4_ = iVar4;
    while (0 < dag._4_4_) {
      pfVar6 = fsg_history_entry_get((fsg_history_t *)search[1].pls,dag._4_4_);
      dag._4_4_ = pfVar6->pred;
      iVar1 = pfVar6->fsglink->wid;
      if ((-1 < iVar1) &&
         ((*(long *)(search[1].type + 0x20) == 0 ||
          (((ulong)*(uint *)(*(long *)(search[1].type + 0x20) + (long)(iVar1 / 0x20) * 4) &
           1L << ((byte)iVar1 & 0x1f)) == 0)))) {
        pdVar2 = d->word;
        pdVar3 = d->word;
        if (iVar1 == -1) {
          local_c0 = "(NULL)";
        }
        else {
          local_c0 = *(char **)(*(long *)(search[1].type + 0x18) + (long)iVar1 * 8);
        }
        sVar5 = dict_wordid(d,local_c0);
        sVar7 = strlen(pdVar2[pdVar3[sVar5].basewid].word);
        _bpidx = sVar7 + 1 + _bpidx;
      }
    }
    ckd_free(search->hyp_str);
    if (_bpidx == 0) {
      search->hyp_str = (char *)0x0;
      search_local = (ps_search_t *)search->hyp_str;
    }
    else {
      pcVar8 = (char *)__ckd_calloc__(1,_bpidx,
                                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fsg_search.c"
                                      ,0x409);
      search->hyp_str = pcVar8;
      len = (size_t)(search->hyp_str + (_bpidx - 1));
      dag._4_4_ = iVar4;
      while (0 < dag._4_4_) {
        pfVar6 = fsg_history_entry_get((fsg_history_t *)search[1].pls,dag._4_4_);
        dag._4_4_ = pfVar6->pred;
        iVar4 = pfVar6->fsglink->wid;
        if ((-1 < iVar4) &&
           ((*(long *)(search[1].type + 0x20) == 0 ||
            (((ulong)*(uint *)(*(long *)(search[1].type + 0x20) + (long)(iVar4 / 0x20) * 4) &
             1L << ((byte)iVar4 & 0x1f)) == 0)))) {
          pdVar2 = d->word;
          pdVar3 = d->word;
          if (iVar4 == -1) {
            local_e8 = "(NULL)";
          }
          else {
            local_e8 = *(char **)(*(long *)(search[1].type + 0x18) + (long)iVar4 * 8);
          }
          sVar5 = dict_wordid(d,local_e8);
          pcVar8 = pdVar2[pdVar3[sVar5].basewid].word;
          sVar7 = strlen(pcVar8);
          len = len - sVar7;
          memcpy((void *)len,pcVar8,sVar7);
          if (search->hyp_str < len) {
            len = len + -1;
            *(char *)len = ' ';
          }
        }
      }
      search_local = (ps_search_t *)search->hyp_str;
    }
  }
  else {
    dag_00 = fsg_search_lattice(search);
    if (dag_00 == (ps_lattice_t *)0x0) {
      err_msg(ERR_WARN,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fsg_search.c"
              ,1000,"Failed to obtain the lattice while bestpath enabled\n");
      search_local = (ps_search_t *)0x0;
    }
    else {
      link_00 = fsg_search_bestpath(search,out_score,0);
      if (link_00 == (ps_latlink_t *)0x0) {
        err_msg(ERR_WARN,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fsg_search.c"
                ,0x3ec,"Failed to find the bestpath in a lattice\n");
        search_local = (ps_search_t *)0x0;
      }
      else {
        search_local = (ps_search_t *)ps_lattice_hyp(dag_00,link_00);
      }
    }
  }
  return (char *)search_local;
}

Assistant:

char const *
fsg_search_hyp(ps_search_t *search, int32 *out_score)
{
    fsg_search_t *fsgs = (fsg_search_t *)search;
    dict_t *dict = ps_search_dict(search);
    char *c;
    size_t len;
    int bp, bpidx;

    /* Get last backpointer table index. */
    bpidx = fsg_search_find_exit(fsgs, fsgs->frame, fsgs->final, out_score);
    /* No hypothesis (yet). */
    if (bpidx <= 0) {
        return NULL;
    }

    /* If bestpath is enabled and the utterance is complete, then run it.
     * Note that setting bestpath in fsg_search_init is disabled by default. */
    if (fsgs->bestpath && fsgs->final) {
        ps_lattice_t *dag;
        ps_latlink_t *link;

        if ((dag = fsg_search_lattice(search)) == NULL) {
    	    E_WARN("Failed to obtain the lattice while bestpath enabled\n");
            return NULL;
        }
        if ((link = fsg_search_bestpath(search, out_score, FALSE)) == NULL) {
    	    E_WARN("Failed to find the bestpath in a lattice\n");
            return NULL;
        }
        return ps_lattice_hyp(dag, link);
    }

    bp = bpidx;
    len = 0;
    while (bp > 0) {
        fsg_hist_entry_t *hist_entry = fsg_history_entry_get(fsgs->history, bp);
        fsg_link_t *fl = fsg_hist_entry_fsglink(hist_entry);
        char const *baseword;
        int32 wid;

        bp = fsg_hist_entry_pred(hist_entry);
        wid = fsg_link_wid(fl);
        if (wid < 0 || fsg_model_is_filler(fsgs->fsg, wid))
            continue;
        baseword = dict_basestr(dict,
                                dict_wordid(dict,
                                            fsg_model_word_str(fsgs->fsg, wid)));
        len += strlen(baseword) + 1;
    }
    
    ckd_free(search->hyp_str);
    if (len == 0) {
	search->hyp_str = NULL;
	return search->hyp_str;
    }
    search->hyp_str = ckd_calloc(1, len);

    bp = bpidx;
    c = search->hyp_str + len - 1;
    while (bp > 0) {
        fsg_hist_entry_t *hist_entry = fsg_history_entry_get(fsgs->history, bp);
        fsg_link_t *fl = fsg_hist_entry_fsglink(hist_entry);
        char const *baseword;
        int32 wid;

        bp = fsg_hist_entry_pred(hist_entry);
        wid = fsg_link_wid(fl);
        if (wid < 0 || fsg_model_is_filler(fsgs->fsg, wid))
            continue;
        baseword = dict_basestr(dict,
                                dict_wordid(dict,
                                            fsg_model_word_str(fsgs->fsg, wid)));
        len = strlen(baseword);
        c -= len;
        memcpy(c, baseword, len);
        if (c > search->hyp_str) {
            --c;
            *c = ' ';
        }
    }

    return search->hyp_str;
}